

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<float> __thiscall
vkt::shaderexecutor::Functions::FaceForward<1>::doExpand
          (FaceForward<1> *this,ExpandContext *param_1,ArgExprs *args)

{
  ExprP<float> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> SStack_58;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_48;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_38;
  SharedPtr<const_vkt::shaderexecutor::Expr<bool>_> local_28;
  float local_14;
  
  dot((Functions *)&local_38,in_RCX + 2,in_RCX + 1);
  local_14 = 0.0;
  constant<float>((shaderexecutor *)&local_48,&local_14);
  operator<((shaderexecutor *)&local_28,(ExprP<float> *)&local_38,(ExprP<float> *)&local_48);
  shaderexecutor::operator-((shaderexecutor *)&SStack_58,in_RCX);
  cond<float>((shaderexecutor *)this,(ExprP<bool> *)&local_28,in_RCX,(ExprP<float> *)&SStack_58);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&SStack_58);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<bool>_>::release(&local_28);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_48);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_38);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
       extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		return cond(dot(args.c, args.b) < constant(0.0f), args.a, -args.a);
	}